

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getLinkType(int index,int *type,Network *nw)

{
  int iVar1;
  long *plVar2;
  char *__to;
  Valve *valve;
  Pipe *pipe;
  Link *link;
  Network *nw_local;
  int *type_local;
  int index_local;
  undefined4 extraout_var;
  
  *type = 1;
  if ((index < 0) || (iVar1 = Network::count(nw,LINK), iVar1 <= index)) {
    type_local._4_4_ = 0xcd;
  }
  else {
    iVar1 = Network::link(nw,(char *)(ulong)(uint)index,__to);
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    iVar1 = (**(code **)(*plVar2 + 0x10))();
    if (iVar1 == 0) {
      if ((*(byte *)(plVar2 + 0x13) & 1) == 0) {
        *type = 1;
      }
      else {
        *type = 0;
      }
    }
    else {
      iVar1 = (**(code **)(*plVar2 + 0x10))();
      if (iVar1 == 1) {
        *type = 2;
      }
      else {
        iVar1 = (**(code **)(*plVar2 + 0x10))();
        if (iVar1 == 2) {
          iVar1 = (**(code **)(*plVar2 + 0x10))();
          *type = iVar1 + 2;
        }
      }
    }
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

int DataManager::getLinkType(int index, int* type, Network* nw)
{
    *type = EN_PIPE;
    if ( index < 0 || index >= nw->count(Element::LINK) ) return 205;
    Link* link = nw->link(index);
    if ( link->type() == Link::PIPE )
    {
        Pipe* pipe = static_cast<Pipe*>(link);
        if ( pipe->hasCheckValve ) *type = EN_CVPIPE;
        else                       *type = EN_PIPE;
    }
    else if (link->type() == Link::PUMP ) *type = EN_PUMP;
    else if ( link->type() == Link::VALVE )
    {
        Valve* valve = static_cast<Valve*>(link);
        *type = valve->type() + EN_PUMP;
    }
    return 0;
}